

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_collecttemplatesfor(_glist *x,int *ntemplatesp,t_symbol ***templatevecp,int wholething)

{
  int iVar1;
  _glist *local_30;
  t_gobj *y;
  int wholething_local;
  t_symbol ***templatevecp_local;
  int *ntemplatesp_local;
  _glist *x_local;
  
  for (local_30 = (_glist *)x->gl_list; local_30 != (_glist *)0x0;
      local_30 = (_glist *)(local_30->gl_obj).te_g.g_next) {
    if (((local_30->gl_obj).te_g.g_pd == scalar_class) &&
       ((wholething != 0 || (iVar1 = glist_isselected(x,(t_gobj *)local_30), iVar1 != 0)))) {
      canvas_addtemplatesforscalar
                ((t_symbol *)(local_30->gl_obj).te_binbuf,(t_word *)&(local_30->gl_obj).te_outlet,
                 ntemplatesp,templatevecp);
    }
    else if (((local_30->gl_obj).te_g.g_pd == canvas_class) &&
            ((wholething != 0 || (iVar1 = glist_isselected(x,(t_gobj *)local_30), iVar1 != 0)))) {
      canvas_collecttemplatesfor(local_30,ntemplatesp,templatevecp,1);
    }
  }
  return;
}

Assistant:

static void canvas_collecttemplatesfor(t_canvas *x, int *ntemplatesp,
    t_symbol ***templatevecp, int wholething)
{
    t_gobj *y;

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
                canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                    ((t_scalar *)y)->sc_vec,  ntemplatesp, templatevecp);
        else if ((pd_class(&y->g_pd) == canvas_class) &&
            (wholething || glist_isselected(x, y)))
                canvas_collecttemplatesfor((t_canvas *)y,
                    ntemplatesp, templatevecp, 1);
    }
}